

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

int main(void)

{
  uint len;
  uint len_00;
  
  for (len_00 = 0; len_00 != 0x80; len_00 = len_00 + 1) {
    test_i8(len_00,0x2a);
    test_i8(len_00,-0x80);
    test_i8(len_00,0x7f);
    test_convert<unsigned_char,float>(len_00,'*');
    test_convert<unsigned_char,float>(len_00,'\0');
    test_convert<unsigned_char,float>(len_00,0xff);
    test_i16(len_00,0x2a);
    test_i16(len_00,-0x8000);
    test_i16(len_00,0x7fff);
    test_convert<unsigned_short,float>(len_00,0x2a);
    test_convert<unsigned_short,float>(len_00,0);
    test_convert<unsigned_short,float>(len_00,0xffff);
    test_i32(len_00,0x2a);
    test_i32(len_00,-0x80000000);
    test_i32(len_00,0x7fffffff);
    test_convert<long,double>(len_00,0x2a);
    test_convert<long,double>(len_00,-0x8000000000000000);
    test_convert<long,double>(len_00,0x7fffffffffffffff);
    test_float(len_00,42.0);
    test_float(len_00,1.1754944e-38);
    test_float(len_00,3.4028235e+38);
    test_float(len_00,1.4013e-45);
    test_float(len_00,1.1920929e-07);
  }
  return 0;
}

Assistant:

int main()
{
    using std::numeric_limits;

    try
    {
        for (unsigned len = 0; len < 128; ++len)
        {
            test_i8(len, 42);
            test_i8(len, numeric_limits<int8_t>::min());
            test_i8(len, numeric_limits<int8_t>::max());

            test_u8(len, 42);
            test_u8(len, numeric_limits<uint8_t>::min());
            test_u8(len, numeric_limits<uint8_t>::max());

            test_i16(len, 42);
            test_i16(len, numeric_limits<int16_t>::min());
            test_i16(len, numeric_limits<int16_t>::max());

            test_u16(len, 42);
            test_u16(len, numeric_limits<uint16_t>::min());
            test_u16(len, numeric_limits<uint16_t>::max());

            test_i32(len, 42);
            test_i32(len, numeric_limits<int32_t>::min());
            test_i32(len, numeric_limits<int32_t>::max());

            test_i64(len, 42);
            test_i64(len, numeric_limits<int64_t>::min());
            test_i64(len, numeric_limits<int64_t>::max());

            test_float(len, 42);
            test_float(len, numeric_limits<float>::min());
            test_float(len, numeric_limits<float>::max());
            test_float(len, numeric_limits<float>::denorm_min());
            test_float(len, numeric_limits<float>::epsilon());
        }
    }
    catch (const Exception& ex)
    {
        std::cerr << "func: " << ex.func_ << " line: " << ex.line_ << " len: " << ex.length_ << std::endl;
        return 1;
    }

    return 0;
}